

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUCS4Transcoder.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XMLUCS4Transcoder::transcodeFrom
          (XMLUCS4Transcoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  uint uVar1;
  XMLCh *pXVar2;
  XMLCh *outPtr;
  uint uVar3;
  UCS4Ch *srcPtr;
  uint *puVar4;
  
  pXVar2 = toFill;
  puVar4 = (uint *)srcData;
  if ((long)(srcCount & 0xfffffffffffffffc) < 1 || (long)maxChars < 1) {
LAB_00251afe:
    *bytesEaten = (long)puVar4 - (long)srcData;
    return (long)pXVar2 - (long)toFill >> 1;
  }
  do {
    uVar1 = *puVar4;
    uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->fSwapped == false) {
      uVar3 = uVar1;
    }
    if (uVar3 < 0x10000) {
      *charSizes = '\x04';
      charSizes = charSizes + 1;
      *pXVar2 = (XMLCh)uVar3;
      pXVar2 = pXVar2 + 1;
    }
    else {
      if (pXVar2 + 1 == toFill + maxChars) goto LAB_00251afe;
      *charSizes = '\x04';
      *pXVar2 = (short)(uVar3 >> 10) + L'ퟀ';
      charSizes[1] = '\0';
      charSizes = charSizes + 2;
      pXVar2[1] = (XMLCh)uVar3 & 0x3ffU | 0xdc00;
      pXVar2 = pXVar2 + 2;
    }
    puVar4 = puVar4 + 1;
    if ((toFill + maxChars <= pXVar2) || (srcData + (srcCount & 0xfffffffffffffffc) <= puVar4))
    goto LAB_00251afe;
  } while( true );
}

Assistant:

XMLSize_t
XMLUCS4Transcoder::transcodeFrom(const  XMLByte* const          srcData
                                , const XMLSize_t               srcCount
                                ,       XMLCh* const            toFill
                                , const XMLSize_t               maxChars
                                ,       XMLSize_t&              bytesEaten
                                ,       unsigned char* const    charSizes)
{
    //
    //  Get pointers to the start and end of the source buffer in terms of
    //  UCS-4 characters.
    //
    const UCS4Ch*   srcPtr = reinterpret_cast<const UCS4Ch*>(srcData);
    const UCS4Ch*   srcEnd = srcPtr + (srcCount / sizeof(UCS4Ch));

    //
    //  Get pointers to the start and end of the target buffer, which is
    //  in terms of the XMLCh chars we output.
    //
    XMLCh*  outPtr = toFill;
    XMLCh*  outEnd = toFill + maxChars;

    //
    //  And get a pointer into the char sizes buffer. We will run this
    //  up as we put chars into the output buffer.
    //
    unsigned char* sizePtr = charSizes;

    //
    //  Now process chars until we either use up all our source or all of
    //  our output space.
    //
    while ((outPtr < outEnd) && (srcPtr < srcEnd))
    {
        //
        //  Get the next UCS char out of the buffer. Don't bump the ptr
        //  yet since we might not have enough storage for it in the target
        //  (if its causes a surrogate pair to be created.
        //
        UCS4Ch nextVal = *srcPtr;

        // If it needs to be swapped, then do it
        if (fSwapped)
            nextVal = BitOps::swapBytes(nextVal);

        // Handle a surrogate pair if needed
        if (nextVal & 0xFFFF0000)
        {
            //
            //  If we don't have room for both of the chars, then we
            //  bail out now.
            //
            if (outPtr + 1 == outEnd)
                break;

            const XMLInt32 LEAD_OFFSET = 0xD800 - (0x10000 >> 10);
	        const XMLCh ch1 = XMLCh(LEAD_OFFSET + (nextVal >> 10));
	        const XMLCh ch2 = XMLCh(0xDC00 + (nextVal & 0x3FF));

            //
            //  We have room so store them both. But note that the
            //  second one took up no source bytes!
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = ch1;
            *sizePtr++ = 0;
            *outPtr++ = ch2;
        }
         else
        {
            //
            //  No surrogate, so just store it and bump the count of chars
            //  read. Update the char sizes buffer for this char's entry.
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = XMLCh(nextVal);
        }

        // Indicate that we ate another UCS char's worth of bytes
        srcPtr++;
    }

    // Set the bytes eaten parameter
    bytesEaten = ((const XMLByte*)srcPtr) - srcData;

    // And return the chars written into the output buffer
    return outPtr - toFill;
}